

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O2

int Kit_GraphLevelNum_rec(Kit_Graph_t *pGraph,Kit_Node_t *pNode)

{
  int iVar1;
  int iVar2;
  Kit_Node_t *pKVar3;
  
  iVar2 = 0;
  if (pGraph->nLeaves <= (int)(((long)pNode - (long)pGraph->pNodes) / 0x18)) {
    pKVar3 = Kit_GraphNodeFanin0(pGraph,pNode);
    iVar1 = Kit_GraphLevelNum_rec(pGraph,pKVar3);
    pKVar3 = Kit_GraphNodeFanin1(pGraph,pNode);
    iVar2 = Kit_GraphLevelNum_rec(pGraph,pKVar3);
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

static inline int          Kit_GraphNodeInt( Kit_Graph_t * pGraph, Kit_Node_t * pNode )   { return pNode - pGraph->pNodes;                      }